

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::BindFromPosition
          (anon_unknown_3 *this,int position,int *value,
          Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack)

{
  bool bVar1;
  Data *pDVar2;
  undefined4 in_register_00000034;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack_local;
  
  pack_local.len_ = (size_type)pack.ptr_;
  pack_local.ptr_ = (pointer)value;
  if (0 < (int)this) {
    if (pack_local.len_ < (pointer)((ulong)this & 0xffffffff)) {
      bVar1 = false;
    }
    else {
      pDVar2 = &Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>::operator[]
                          (&pack_local,
                           (size_type)
                           ((long)&((pointer)((ulong)this & 0xffffffff))[-1].dispatcher_ + 7))->
                data_;
      bVar1 = (*(code *)pDVar2[1])
                        (*pDVar2,(FormatConversionSpecImpl)ZEXT812(0x90013),
                         (void *)CONCAT44(in_register_00000034,position));
    }
    return bVar1;
  }
  __assert_fail("position > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/bind.cc"
                ,0x2c,
                "bool absl::str_format_internal::(anonymous namespace)::BindFromPosition(int, int *, absl::Span<const FormatArgImpl>)"
               );
}

Assistant:

inline bool BindFromPosition(int position, int* value,
                             absl::Span<const FormatArgImpl> pack) {
  assert(position > 0);
  if (static_cast<size_t>(position) > pack.size()) {
    return false;
  }
  // -1 because positions are 1-based
  return FormatArgImplFriend::ToInt(pack[static_cast<size_t>(position) - 1],
                                    value);
}